

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O3

int Aig_ObjCheckTfi_rec(Aig_Man_t *p,Aig_Obj_t *pNode,Aig_Obj_t *pOld)

{
  int iVar1;
  
  if (pNode != (Aig_Obj_t *)0x0) {
    while ((*(uint *)&pNode->field_0x18 & 7) != 2) {
      if (pNode == pOld) {
        return 1;
      }
      if (pNode->TravId == p->nTravIds) {
        return 0;
      }
      pNode->TravId = p->nTravIds;
      iVar1 = Aig_ObjCheckTfi_rec(p,(Aig_Obj_t *)((ulong)pNode->pFanin0 & 0xfffffffffffffffe),pOld);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = Aig_ObjCheckTfi_rec(p,(Aig_Obj_t *)((ulong)pNode->pFanin1 & 0xfffffffffffffffe),pOld);
      if (iVar1 != 0) {
        return 1;
      }
      if (p->pEquivs == (Aig_Obj_t **)0x0) {
        return 0;
      }
      pNode = p->pEquivs[pNode->Id];
      if (pNode == (Aig_Obj_t *)0x0) {
        return 0;
      }
    }
  }
  return 0;
}

Assistant:

int Aig_ObjCheckTfi_rec( Aig_Man_t * p, Aig_Obj_t * pNode, Aig_Obj_t * pOld )
{
    // check the trivial cases
    if ( pNode == NULL )
        return 0;
    if ( Aig_ObjIsCi(pNode) )
        return 0;
//    if ( pNode->Id < pOld->Id ) // cannot use because of choices of pNode
//        return 0;
    if ( pNode == pOld )
        return 1;
    // skip the visited node
    if ( Aig_ObjIsTravIdCurrent( p, pNode ) )
        return 0;
    Aig_ObjSetTravIdCurrent( p, pNode );
    // check the children
    if ( Aig_ObjCheckTfi_rec( p, Aig_ObjFanin0(pNode), pOld ) )
        return 1;
    if ( Aig_ObjCheckTfi_rec( p, Aig_ObjFanin1(pNode), pOld ) )
        return 1;
    // check equivalent nodes
    return Aig_ObjCheckTfi_rec( p, Aig_ObjEquiv(p, pNode), pOld );
}